

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

int ctemplate_htmlparser::htmlparser_attr_type(htmlparser_ctx *ctx)

{
  char cVar1;
  int iVar2;
  int iVar3;
  meta_redirect_type_enum mVar4;
  char *pcVar5;
  char *pcVar6;
  
  iVar2 = statemachine_get_state(ctx->statemachine);
  if ((long)iVar2 - 0x15U < 0xfffffffffffffff8) {
    return 0;
  }
  pcVar5 = ctx->attr;
  switch(ctx->attr[0]) {
  case 'a':
    iVar2 = strcmp(pcVar5,"action");
    if (iVar2 == 0) {
      return 2;
    }
    pcVar6 = "archive";
    goto LAB_0013048a;
  case 'b':
    pcVar6 = "background";
    break;
  case 'c':
    iVar2 = strcmp(pcVar5,"cite");
    if (iVar2 == 0) {
      return 2;
    }
    iVar2 = strcmp(pcVar5,"classid");
    if (iVar2 == 0) {
      return 2;
    }
    pcVar6 = "codebase";
    goto LAB_0013048a;
  case 'd':
    iVar2 = strcmp(pcVar5,"data");
    if (iVar2 == 0) {
      return 2;
    }
    pcVar6 = "dynsrc";
LAB_0013048a:
    iVar2 = strcmp(pcVar5,pcVar6);
    if (iVar2 == 0) {
      return 2;
    }
  default:
    goto switchD_001303d3_caseD_65;
  case 'h':
    pcVar6 = "href";
    break;
  case 'l':
    pcVar6 = "longdesc";
    break;
  case 'o':
    if (ctx->attr[1] == 'n') {
      return 3;
    }
    goto switchD_001303d3_caseD_65;
  case 's':
    pcVar6 = "src";
    break;
  case 'u':
    pcVar6 = "usemap";
  }
  iVar2 = strcmp(pcVar5,pcVar6);
  if (iVar2 == 0) {
    iVar2 = 2;
  }
  else {
switchD_001303d3_caseD_65:
    iVar2 = strcmp(pcVar5,"style");
    if (iVar2 == 0) {
      iVar2 = 4;
    }
    else {
      cVar1 = ctx->tag[0];
      iVar2 = statemachine_get_state(ctx->statemachine);
      if ((((cVar1 != '\0') && (iVar3 = strcmp(ctx->tag,"meta"), (long)iVar2 - 0xdU < 8)) &&
          (iVar3 == 0)) && (iVar2 = strcmp(pcVar5,"content"), iVar2 == 0)) {
        pcVar5 = htmlparser_value(ctx);
        mVar4 = meta_redirect_type(pcVar5);
        if (mVar4 != META_REDIRECT_TYPE_NONE) {
          return 2;
        }
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int htmlparser_attr_type(htmlparser_ctx *ctx)
{
    if (!htmlparser_in_attr(ctx))
        return HTMLPARSER_ATTR_NONE;

    if (is_js_attribute(ctx->attr))
        return HTMLPARSER_ATTR_JS;

    if (is_uri_attribute(ctx->attr))
        return HTMLPARSER_ATTR_URI;

    if (is_style_attribute(ctx->attr))
        return HTMLPARSER_ATTR_STYLE;

    const char* tag = htmlparser_tag(ctx);
    const char* attr = htmlparser_attr(ctx);

    /* Special logic to handle meta redirect type tags. */
    if (tag && strcmp(tag, "meta") == 0 &&
        attr && strcmp(attr, "content") == 0) {

      const char* value = htmlparser_value(ctx);
      meta_redirect_type_enum redirect_type = meta_redirect_type(value);

      if (redirect_type == META_REDIRECT_TYPE_URL ||
          redirect_type == META_REDIRECT_TYPE_URL_START)
        return HTMLPARSER_ATTR_URI;
    }

    return HTMLPARSER_ATTR_REGULAR;
}